

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

void secp256k1_scalar_cadd_bit(secp256k1_scalar *r,uint bit,int flag)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  bVar4 = (byte)bit;
  uVar6 = (flag - 1U & 0x100) + bit;
  uVar8 = uVar6 >> 6;
  uVar5 = (ulong)(uVar6 < 0x40) << (bVar4 & 0x3f);
  uVar7 = (ulong)(uVar8 == 1) << (bVar4 & 0x3f);
  uVar9 = (ulong)(uVar8 == 2) << (bVar4 & 0x3f);
  uVar2 = r->d[0];
  r->d[0] = r->d[0] + uVar5;
  puVar1 = r->d + 1;
  uVar5 = (ulong)CARRY8(uVar2,uVar5);
  uVar2 = *puVar1;
  uVar3 = *puVar1 + uVar7;
  *puVar1 = uVar3 + uVar5;
  puVar1 = r->d + 2;
  uVar5 = (ulong)(CARRY8(uVar2,uVar7) || CARRY8(uVar3,uVar5));
  uVar2 = *puVar1;
  uVar3 = *puVar1 + uVar9;
  *puVar1 = uVar3 + uVar5;
  r->d[3] = r->d[3] + ((ulong)(uVar8 == 3) << (bVar4 & 0x3f)) +
            (ulong)(CARRY8(uVar2,uVar9) || CARRY8(uVar3,uVar5));
  return;
}

Assistant:

static void secp256k1_scalar_cadd_bit(secp256k1_scalar *r, unsigned int bit, int flag) {
    uint128_t t;
    VERIFY_CHECK(bit < 256);
    bit += ((uint32_t) flag - 1) & 0x100;  /* forcing (bit >> 6) > 3 makes this a noop */
    t = (uint128_t)r->d[0] + (((uint64_t)((bit >> 6) == 0)) << (bit & 0x3F));
    r->d[0] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)r->d[1] + (((uint64_t)((bit >> 6) == 1)) << (bit & 0x3F));
    r->d[1] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)r->d[2] + (((uint64_t)((bit >> 6) == 2)) << (bit & 0x3F));
    r->d[2] = t & 0xFFFFFFFFFFFFFFFFULL; t >>= 64;
    t += (uint128_t)r->d[3] + (((uint64_t)((bit >> 6) == 3)) << (bit & 0x3F));
    r->d[3] = t & 0xFFFFFFFFFFFFFFFFULL;
#ifdef VERIFY
    VERIFY_CHECK((t >> 64) == 0);
    VERIFY_CHECK(secp256k1_scalar_check_overflow(r) == 0);
#endif
}